

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckNonWritableDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  DiagnosticStream *pDVar4;
  Feature *pFVar5;
  StorageClass local_3fc;
  StorageClass local_3f8;
  char *local_3f0;
  DiagnosticStream local_3e8;
  StorageClass local_20c;
  undefined1 local_208 [4];
  StorageClass var_storage_class;
  uint32_t local_30;
  Op local_2c;
  uint32_t type_id;
  Op opcode;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  _type_id = decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  uVar2 = Instruction::id(inst);
  if (uVar2 == 0) {
    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x6a5,
                  "spv_result_t spvtools::val::(anonymous namespace)::CheckNonWritableDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                 );
  }
  iVar3 = Decoration::struct_member_index(_type_id);
  if (iVar3 == -1) {
    local_2c = Instruction::opcode((Instruction *)decoration_local);
    local_30 = Instruction::type_id((Instruction *)decoration_local);
    if ((((local_2c != OpVariable) && (local_2c != OpUntypedVariableKHR)) &&
        (local_2c != OpFunctionParameter)) && (local_2c != OpRawAccessChainNV)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      pDVar4 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_208,
                          (char (*) [106])
                          "Target of NonWritable decoration must be a memory object declaration (a variable or a function parameter)"
                         );
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return vstate_local._4_4_;
    }
    if (local_2c == OpVariable) {
      local_3f8 = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)decoration_local,2);
    }
    else {
      if (local_2c == OpUntypedVariableKHR) {
        local_3fc = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)decoration_local,3);
      }
      else {
        local_3fc = Max;
      }
      local_3f8 = local_3fc;
    }
    local_20c = local_3f8;
    if (((((local_3f8 != Function) && (local_3f8 != Private)) ||
         (pFVar5 = ValidationState_t::features((ValidationState_t *)inst_local),
         (pFVar5->nonwritable_var_in_function_or_private & 1U) == 0)) &&
        ((bVar1 = ValidationState_t::IsPointerToUniformBlock
                            ((ValidationState_t *)inst_local,local_30), !bVar1 &&
         (bVar1 = ValidationState_t::IsPointerToStorageBuffer
                            ((ValidationState_t *)inst_local,local_30), !bVar1)))) &&
       ((bVar1 = ValidationState_t::IsPointerToStorageImage
                           ((ValidationState_t *)inst_local,local_30), !bVar1 &&
        (local_2c != OpRawAccessChainNV)))) {
      ValidationState_t::diag
                (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_3e8,
                          (char (*) [92])
                          "Target of NonWritable decoration is invalid: must point to a storage image, uniform block, "
                         );
      pFVar5 = ValidationState_t::features((ValidationState_t *)inst_local);
      local_3f0 = "or storage buffer";
      if ((pFVar5->nonwritable_var_in_function_or_private & 1U) != 0) {
        local_3f0 = "storage buffer, or variable in Private or Function storage class";
      }
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_3f0);
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
      return vstate_local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CheckNonWritableDecoration(ValidationState_t& vstate,
                                        const Instruction& inst,
                                        const Decoration& decoration) {
  assert(inst.id() && "Parser ensures the target of the decoration has an ID");

  if (decoration.struct_member_index() == Decoration::kInvalidMember) {
    // The target must be a memory object declaration.
    // First, it must be a variable or function parameter.
    const auto opcode = inst.opcode();
    const auto type_id = inst.type_id();
    if (opcode != spv::Op::OpVariable &&
        opcode != spv::Op::OpUntypedVariableKHR &&
        opcode != spv::Op::OpFunctionParameter &&
        opcode != spv::Op::OpRawAccessChainNV) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "Target of NonWritable decoration must be a memory object "
                "declaration (a variable or a function parameter)";
    }
    const auto var_storage_class =
        opcode == spv::Op::OpVariable
            ? inst.GetOperandAs<spv::StorageClass>(2)
            : opcode == spv::Op::OpUntypedVariableKHR
                  ? inst.GetOperandAs<spv::StorageClass>(3)
                  : spv::StorageClass::Max;
    if ((var_storage_class == spv::StorageClass::Function ||
         var_storage_class == spv::StorageClass::Private) &&
        vstate.features().nonwritable_var_in_function_or_private) {
      // New permitted feature in SPIR-V 1.4.
    } else if (
        // It may point to a UBO, SSBO, storage image, or raw access chain.
        vstate.IsPointerToUniformBlock(type_id) ||
        vstate.IsPointerToStorageBuffer(type_id) ||
        vstate.IsPointerToStorageImage(type_id) ||
        opcode == spv::Op::OpRawAccessChainNV) {
    } else {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "Target of NonWritable decoration is invalid: must point to a "
                "storage image, uniform block, "
             << (vstate.features().nonwritable_var_in_function_or_private
                     ? "storage buffer, or variable in Private or Function "
                       "storage class"
                     : "or storage buffer");
    }
  }

  return SPV_SUCCESS;
}